

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork_enums.h
# Opt level: O1

char * MLActivationParamsNonlinearityType_Name(MLActivationParamsNonlinearityType x)

{
  if ((int)x < 0x1f) {
    if ((int)x < 0xf) {
      if (x != MLActivationParamsNonlinearityType_NOT_SET) {
        if (x == MLActivationParamsNonlinearityType_linear) {
          return "MLActivationParamsNonlinearityType_linear";
        }
        if (x == MLActivationParamsNonlinearityType_ReLU) {
          return "MLActivationParamsNonlinearityType_ReLU";
        }
      }
    }
    else if ((int)x < 0x19) {
      if (x == MLActivationParamsNonlinearityType_leakyReLU) {
        return "MLActivationParamsNonlinearityType_leakyReLU";
      }
      if (x == MLActivationParamsNonlinearityType_thresholdedReLU) {
        return "MLActivationParamsNonlinearityType_thresholdedReLU";
      }
    }
    else {
      if (x == MLActivationParamsNonlinearityType_PReLU) {
        return "MLActivationParamsNonlinearityType_PReLU";
      }
      if (x == MLActivationParamsNonlinearityType_tanh) {
        return "MLActivationParamsNonlinearityType_tanh";
      }
    }
  }
  else if ((int)x < 0x32) {
    if (x == MLActivationParamsNonlinearityType_scaledTanh) {
      return "MLActivationParamsNonlinearityType_scaledTanh";
    }
    if (x == MLActivationParamsNonlinearityType_sigmoid) {
      return "MLActivationParamsNonlinearityType_sigmoid";
    }
    if (x == MLActivationParamsNonlinearityType_sigmoidHard) {
      return "MLActivationParamsNonlinearityType_sigmoidHard";
    }
  }
  else if ((int)x < 0x46) {
    if (x == MLActivationParamsNonlinearityType_ELU) {
      return "MLActivationParamsNonlinearityType_ELU";
    }
    if (x == MLActivationParamsNonlinearityType_softsign) {
      return "MLActivationParamsNonlinearityType_softsign";
    }
  }
  else {
    if (x == MLActivationParamsNonlinearityType_softplus) {
      return "MLActivationParamsNonlinearityType_softplus";
    }
    if (x == MLActivationParamsNonlinearityType_parametricSoftplus) {
      return "MLActivationParamsNonlinearityType_parametricSoftplus";
    }
  }
  return "INVALID";
}

Assistant:

__attribute__((__unused__))
static const char * MLActivationParamsNonlinearityType_Name(MLActivationParamsNonlinearityType x) {
    switch (x) {
        case MLActivationParamsNonlinearityType_linear:
            return "MLActivationParamsNonlinearityType_linear";
        case MLActivationParamsNonlinearityType_ReLU:
            return "MLActivationParamsNonlinearityType_ReLU";
        case MLActivationParamsNonlinearityType_leakyReLU:
            return "MLActivationParamsNonlinearityType_leakyReLU";
        case MLActivationParamsNonlinearityType_thresholdedReLU:
            return "MLActivationParamsNonlinearityType_thresholdedReLU";
        case MLActivationParamsNonlinearityType_PReLU:
            return "MLActivationParamsNonlinearityType_PReLU";
        case MLActivationParamsNonlinearityType_tanh:
            return "MLActivationParamsNonlinearityType_tanh";
        case MLActivationParamsNonlinearityType_scaledTanh:
            return "MLActivationParamsNonlinearityType_scaledTanh";
        case MLActivationParamsNonlinearityType_sigmoid:
            return "MLActivationParamsNonlinearityType_sigmoid";
        case MLActivationParamsNonlinearityType_sigmoidHard:
            return "MLActivationParamsNonlinearityType_sigmoidHard";
        case MLActivationParamsNonlinearityType_ELU:
            return "MLActivationParamsNonlinearityType_ELU";
        case MLActivationParamsNonlinearityType_softsign:
            return "MLActivationParamsNonlinearityType_softsign";
        case MLActivationParamsNonlinearityType_softplus:
            return "MLActivationParamsNonlinearityType_softplus";
        case MLActivationParamsNonlinearityType_parametricSoftplus:
            return "MLActivationParamsNonlinearityType_parametricSoftplus";
        case MLActivationParamsNonlinearityType_NOT_SET:
            return "INVALID";
    }
    return "INVALID";
}